

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O0

SXML_CHAR * strip_spaces(SXML_CHAR *str,SXML_CHAR repl_sq)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  ushort **ppuVar4;
  size_t sVar5;
  bool bVar6;
  int local_2c;
  int len;
  int i;
  SXML_CHAR *p;
  SXML_CHAR repl_sq_local;
  SXML_CHAR *str_local;
  
  _len = str;
  while( true ) {
    bVar6 = false;
    if (((*_len != '\0') && (bVar6 = false, -1 < *_len)) && (bVar6 = false, *_len < -0x80)) {
      ppuVar4 = __ctype_b_loc();
      bVar6 = ((*ppuVar4)[(int)*_len] & 0x2000) != 0;
    }
    if (!bVar6) break;
    _len = _len + 1;
  }
  sVar5 = strlen(str);
  local_2c = (int)sVar5;
  do {
    iVar2 = local_2c;
    local_2c = iVar2 + -1;
    bVar6 = false;
    if (((-1 < local_2c) && (bVar6 = false, -1 < str[local_2c])) &&
       (bVar6 = false, str[local_2c] < -0x80)) {
      ppuVar4 = __ctype_b_loc();
      bVar6 = ((*ppuVar4)[(int)str[local_2c]] & 0x2000) != 0;
    }
  } while (bVar6);
  if ((-1 < local_2c) && (str[local_2c] == '\\')) {
    local_2c = iVar2;
  }
  str[local_2c + 1] = '\0';
  if (repl_sq == '\0') {
    if ((_len != str) || (local_2c != (int)sVar5)) {
      local_2c = 0;
      for (; cVar1 = *_len, str[local_2c] = cVar1, cVar1 != '\0'; _len = _len + 1) {
        local_2c = local_2c + 1;
      }
    }
  }
  else {
    local_2c = 0;
    while (*_len != '\0') {
      if (((*_len < '\0') || ('\x7f' < *_len)) ||
         (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)*_len] & 0x2000) == 0)) {
        if (*_len == '\\') {
          _len = _len + 1;
        }
        str[local_2c] = *_len;
        _len = _len + 1;
      }
      else {
        str[local_2c] = repl_sq;
        do {
          bVar6 = false;
          pcVar3 = _len + 1;
          if (-1 < _len[1]) {
            bVar6 = false;
            pcVar3 = _len + 2;
            if (_len[2] < -0x80) {
              ppuVar4 = __ctype_b_loc();
              bVar6 = ((*ppuVar4)[(int)_len[3]] & 0x2000) != 0;
              pcVar3 = _len + 3;
            }
          }
          _len = pcVar3;
        } while (bVar6);
      }
      local_2c = local_2c + 1;
    }
    str[local_2c] = '\0';
  }
  return str;
}

Assistant:

SXML_CHAR* strip_spaces(SXML_CHAR* str, SXML_CHAR repl_sq)
{
	SXML_CHAR* p;
	int i, len;
	
	/* 'p' to the first non-space */
	for (p = str; *p != NULC && sx_isspace(*p); p++) ; /* No need to search for 'protect' as it is not a space */
	len = sx_strlen(str);
	for (i = len-1; i >= 0 && sx_isspace(str[i]); i--) ;
	if (i >= 0 && str[i] == C2SX('\\')) /* If last non-space is the protection, keep the last space */
		i++;
	str[i+1] = NULC; /* New end of string to last non-space */
	
	if (repl_sq == NULC) {
		if (p == str && i == len)
			return str; /* Nothing to do */
		for (i = 0; (str[i] = *p) != NULC; i++, p++) ; /* Copy 'p' to 'str' */
		return str;
	}
	
	/* Squeeze all spaces with 'repl_sq' */
	i = 0;
	while (*p != NULC) {
		if (sx_isspace(*p)) {
			str[i++] = repl_sq;
			while (sx_isspace(*++p)) ; /* Skips all next spaces */
		} else {
			if (*p == C2SX('\\'))
				p++;
			str[i++] = *p++;
		}
	}
	str[i] = NULC;
	
	return str;
}